

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall ncnn::Net::Net(Net *this)

{
  Option::Option(&this->opt);
  (this->custom_layer_registry).
  super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->custom_layer_registry).
  super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->custom_layer_registry).
  super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Net::Net()
{
#if NCNN_VULKAN
    vkdev = 0;
    weight_vkallocator = 0;
    weight_staging_vkallocator = 0;

    cast_float32_to_float16 = 0;
    cast_float16_to_float32 = 0;
    packing_pack1 = 0;
    packing_pack4 = 0;
    packing_pack8 = 0;
#endif // NCNN_VULKAN
}